

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  
  uVar3 = (this->IndexLookup).Size;
  if ((int)uVar3 < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0xb6d,"AddRemapChar","ImGui ASSERT FAILED: %s","IndexLookup.Size > 0");
    uVar3 = (this->IndexLookup).Size;
  }
  uVar4 = (uint)dst;
  if (dst < uVar3) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    GrowIndex(this,dst + 1);
    if (uVar3 <= src) {
      if ((this->IndexLookup).Size <= (int)uVar4) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (this->IndexLookup).Data[dst] = 0xffff;
      fVar5 = 1.0;
      goto LAB_001d0305;
    }
  }
  else {
    if (uVar3 <= src) {
      return;
    }
    GrowIndex(this,dst + 1);
  }
  puVar2 = (this->IndexLookup).Data;
  uVar1 = puVar2[src];
  if ((this->IndexLookup).Size <= (int)uVar4) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    puVar2 = (this->IndexLookup).Data;
  }
  puVar2[dst] = uVar1;
  fVar5 = (this->IndexAdvanceX).Data[src];
LAB_001d0305:
  if ((this->IndexAdvanceX).Size <= (int)uVar4) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  (this->IndexAdvanceX).Data[dst] = fVar5;
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}